

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::MixedMaxAttributesTest::iterate(MixedMaxAttributesTest *this)

{
  undefined1 *puVar1;
  deInt32 dVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  deUint32 layoutLocation;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  uint uVar8;
  string local_2e8;
  int local_2c4;
  long *local_2c0 [2];
  long local_2b0 [2];
  AttribType *local_2a0;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  Attribute local_258;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar2 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  local_2c4 = 1;
  if (this->m_arraySize != -1) {
    local_2c4 = this->m_arraySize;
  }
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  puVar1 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"GL_MAX_VERTEX_ATTRIBS: ",0x17);
  std::ostream::operator<<(puVar1,dVar2);
  tcu::MessageBuilder::operator<<((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
  std::ios_base::~ios_base
            ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x78);
  layoutLocation = dVar2 - (this->m_type).m_locationSize * local_2c4;
  if (-1 < (int)layoutLocation) {
    local_2a0 = &this->m_type;
    puVar1 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
    uVar8 = 0;
    do {
      if ((uVar8 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x1caf620);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8.field_2._8_8_ = plVar3[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_2e8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_
                      ,1);
        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._32_2_ = 0x5f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
        s.super_basic_ostream<char,_std::char_traits<char>_>._34_1_ = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = puVar1;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_258,local_2a0,&local_2e8,-1,(Cond *)&s,this->m_arraySize);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_cond.m_name._M_dataplus._M_p != &local_258.m_cond.m_name.field_2) {
          operator_delete(local_258.m_cond.m_name._M_dataplus._M_p,
                          local_258.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_name._M_dataplus._M_p != &local_258.m_name.field_2) {
          operator_delete(local_258.m_name._M_dataplus._M_p,
                          local_258.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
          operator_delete(local_258.m_type.m_name._M_dataplus._M_p,
                          local_258.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1) {
          operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                          s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_2c0[0] != local_2b0) {
          operator_delete(local_2c0[0],local_2b0[0] + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x1caf620);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar5 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8.field_2._8_8_ = puVar4[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_2e8._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        local_258.m_type.m_name._M_dataplus._M_p = (pointer)&local_258.m_type.m_name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_2e8._M_dataplus._M_p,
                   local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
        local_258.m_type.m_locationSize = layoutLocation;
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_258);
        uVar6 = local_258.m_type.m_name.field_2._M_allocated_capacity;
        _Var7._M_p = local_258.m_type.m_name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
LAB_0188aa95:
          operator_delete(_Var7._M_p,uVar6 + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        std::ostream::operator<<((Cond *)&s,uVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
        std::ios_base::~ios_base
                  ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x1caf620);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8.field_2._8_8_ = plVar3[3];
        }
        else {
          local_2e8.field_2._M_allocated_capacity = *psVar5;
          local_2e8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_2e8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_
                      ,1);
        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._32_2_ = 0x5f5f;
        s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
        s.super_basic_ostream<char,_std::char_traits<char>_>._34_1_ = 0;
        s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = puVar1;
        AttributeLocationTestUtil::Attribute::Attribute
                  (&local_258,local_2a0,&local_2e8,layoutLocation,(Cond *)&s,this->m_arraySize);
        std::
        vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
        ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_cond.m_name._M_dataplus._M_p != &local_258.m_cond.m_name.field_2) {
          operator_delete(local_258.m_cond.m_name._M_dataplus._M_p,
                          local_258.m_cond.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_name._M_dataplus._M_p != &local_258.m_name.field_2) {
          operator_delete(local_258.m_name._M_dataplus._M_p,
                          local_258.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258.m_type.m_name._M_dataplus._M_p != &local_258.m_type.m_name.field_2) {
          operator_delete(local_258.m_type.m_name._M_dataplus._M_p,
                          local_258.m_type.m_name.field_2._M_allocated_capacity + 1);
        }
        uVar6 = s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
        _Var7._M_p = (pointer)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1)
        goto LAB_0188aa95;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0[0] != local_2b0) {
        operator_delete(local_2c0[0],local_2b0[0] + 1);
      }
      uVar8 = uVar8 + 1;
      layoutLocation = layoutLocation - (this->m_type).m_locationSize * local_2c4;
    } while (-1 < (int)layoutLocation);
  }
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult MixedMaxAttributesTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Bind>		bindings;
	vector<Attribute>	attributes;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - (arrayElementCount * m_type.getLocationSize()); loc >= 0; loc -= (arrayElementCount * m_type.getLocationSize()))
	{
		if ((ndx % 2) != 0)
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), loc, Cond::COND_ALWAYS, m_arraySize));
		else
		{
			attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), Attribute::LOC_UNDEF, Cond::COND_ALWAYS, m_arraySize));
			bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		}
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}